

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O3

void rollback_all_test(bool multi_kv)

{
  bool bVar1;
  fdb_status fVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  __atomic_base<unsigned_long> metalen;
  long extraout_RDX;
  code *__ptr;
  long lVar8;
  timeval *__tv;
  fdb_config *fconfig_00;
  fdb_kvs_handle **ppfVar9;
  uint uVar10;
  uint uVar11;
  fdb_kvs_handle *pfVar12;
  fdb_kvs_handle *pfVar13;
  fdb_kvs_handle *pfVar14;
  fdb_kvs_handle *pfVar15;
  undefined7 in_register_00000039;
  fdb_kvs_handle **ppfVar16;
  fdb_kvs_handle *unaff_R12;
  fdb_kvs_handle *unaff_R13;
  ulong uVar17;
  btree *doc;
  char *pcVar18;
  filemgr_ops *pfVar19;
  fdb_config *fconfig_01;
  fdb_kvs_handle **__s;
  char *pcVar20;
  fdb_kvs_handle *doc_00;
  fdb_kvs_handle *pfVar21;
  fdb_file_handle *dbfile;
  uint64_t num_markers;
  fdb_snapshot_info_t *markers;
  fdb_kvs_handle *dbhandle;
  size_t bodylen;
  char kv_name [8];
  fdb_kvs_config kvs_config;
  fdb_kvs_info info;
  timeval __test_begin;
  char metabuf [256];
  char keybuf [256];
  char bodybuf [256];
  fdb_config fconfig;
  fdb_kvs_handle *pfStack_38e8;
  fdb_kvs_handle *pfStack_38e0;
  fdb_file_handle *pfStack_38d8;
  fdb_iterator *pfStack_38d0;
  fdb_doc *pfStack_38c8;
  fdb_kvs_handle *pfStack_38c0;
  timeval tStack_38b8;
  fdb_kvs_config fStack_38a8;
  fdb_config fStack_3890;
  fdb_config *pfStack_3798;
  fdb_kvs_handle *pfStack_3790;
  fdb_kvs_handle *pfStack_3788;
  fdb_file_handle *pfStack_3780;
  fdb_kvs_handle *pfStack_3778;
  char acStack_376f [15];
  filemgr *pfStack_3760;
  docio_handle *pdStack_3758;
  btreeblk_handle *pbStack_3750;
  size_t sStack_3748;
  filemgr *pfStack_3740;
  docio_handle *pdStack_3738;
  btreeblk_handle *pbStack_3730;
  timeval tStack_3728;
  undefined1 auStack_3718 [76];
  uint uStack_36cc;
  char *pcStack_35d8;
  atomic<unsigned_long> aStack_35d0;
  btree *pbStack_35c8;
  fdb_kvs_handle *pfStack_35c0;
  fdb_kvs_handle *pfStack_35b8;
  code *pcStack_35b0;
  uint uStack_359c;
  fdb_txn *pfStack_3598;
  fdb_kvs_handle *pfStack_3590;
  fdb_iterator *pfStack_3588;
  fdb_snapshot_info_t *pfStack_3580;
  int iStack_3574;
  fdb_kvs_handle *pfStack_3570;
  fdb_kvs_handle *apfStack_3568 [3];
  uint64_t uStack_3550;
  fdb_kvs_config fStack_3548;
  char acStack_3530 [8];
  timeval tStack_3528;
  char acStack_3518 [256];
  btree bStack_3418;
  char acStack_33c8 [256];
  char acStack_32c8 [256];
  fdb_config fStack_31c8;
  fdb_kvs_handle **ppfStack_30d0;
  fdb_kvs_handle **ppfStack_30c8;
  fdb_kvs_handle *pfStack_30c0;
  fdb_kvs_handle **ppfStack_30b8;
  fdb_kvs_handle *pfStack_30b0;
  code *pcStack_30a8;
  fdb_kvs_handle **ppfStack_30a0;
  fdb_kvs_handle *pfStack_3098;
  fdb_kvs_handle *apfStack_3090 [9];
  fdb_kvs_config fStack_3048;
  timeval tStack_3030;
  fdb_kvs_handle *apfStack_3020 [33];
  fdb_config fStack_2f18;
  fdb_kvs_handle *apfStack_2e20 [32];
  fdb_kvs_handle *apfStack_2d20 [32];
  fdb_kvs_handle afStack_2c20 [15];
  fdb_config *pfStack_c18;
  fdb_kvs_handle *pfStack_c10;
  fdb_kvs_handle *pfStack_c08;
  fdb_config *pfStack_c00;
  fdb_kvs_handle *pfStack_bf8;
  fdb_kvs_handle *pfStack_bf0;
  fdb_kvs_handle *pfStack_be0;
  fdb_file_handle *pfStack_bd8;
  fdb_iterator *pfStack_bd0;
  fdb_doc *pfStack_bc8;
  fdb_kvs_handle *pfStack_bc0;
  undefined1 auStack_bb7 [31];
  undefined1 auStack_b98 [72];
  fdb_config fStack_b50;
  timeval *ptStack_a58;
  fdb_kvs_handle *pfStack_a50;
  fdb_kvs_handle *pfStack_a48;
  fdb_config *pfStack_a40;
  fdb_kvs_handle *pfStack_a38;
  fdb_kvs_handle *pfStack_a28;
  fdb_file_handle *pfStack_a20;
  undefined4 uStack_a14;
  pthread_t pStack_a10;
  undefined1 auStack_a07 [63];
  undefined1 auStack_9c8 [16];
  uint64_t uStack_9b8;
  fdb_config fStack_8d0;
  fdb_kvs_handle *pfStack_7d0;
  fdb_kvs_handle *pfStack_7c8;
  filemgr_ops *pfStack_7c0;
  fdb_kvs_handle *pfStack_7b8;
  fdb_kvs_handle *pfStack_7b0;
  timeval tStack_7a0;
  fdb_kvs_handle *pfStack_790;
  fdb_kvs_handle *pfStack_788;
  fdb_kvs_handle *pfStack_778;
  fdb_kvs_handle *pfStack_770;
  fdb_kvs_handle *pfStack_768;
  fdb_file_handle *pfStack_760;
  undefined1 auStack_754 [12];
  kvs_ops_stat *pkStack_748;
  atomic<unsigned_long> aStack_740;
  timeval tStack_710;
  __atomic_base<unsigned_long> _Stack_700;
  kvs_ops_stat *pkStack_6f8;
  __atomic_base<unsigned_long> _Stack_6f0;
  fdb_kvs_info fStack_6e0;
  undefined1 uStack_690;
  undefined1 uStack_682;
  btree *pbStack_678;
  code *pcStack_658;
  uint8_t auStack_650 [8];
  filemgr_ops *pfStack_648;
  fdb_kvs_handle *pfStack_5b8;
  fdb_kvs_handle *pfStack_5b0;
  fdb_kvs_handle *pfStack_5a8;
  fdb_txn *pfStack_5a0;
  fdb_kvs_handle *pfStack_598;
  fdb_kvs_handle *pfStack_590;
  fdb_file_handle *local_580;
  int local_574;
  fdb_kvs_handle *local_570;
  fdb_kvs_handle *local_568;
  undefined1 local_560 [48];
  __atomic_base<unsigned_long> local_530;
  undefined1 local_528 [32];
  fdb_kvs_info local_508;
  timeval local_4d8;
  undefined1 local_4c8 [160];
  char local_428 [256];
  char local_328 [256];
  char local_228 [256];
  fdb_config local_128;
  
  pfStack_590 = (fdb_kvs_handle *)0x11afe4;
  gettimeofday(&local_4d8,(__timezone_ptr_t)0x0);
  pfStack_590 = (fdb_kvs_handle *)0x11afe9;
  memleak_start();
  pfStack_590 = (fdb_kvs_handle *)0x11aff5;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_590 = (fdb_kvs_handle *)0x11b005;
  fdb_get_default_config();
  pfStack_590 = (fdb_kvs_handle *)0x11b00f;
  fdb_get_default_kvs_config();
  local_128.buffercache_size = 0;
  local_128.wal_threshold = 0x400;
  local_128.flags = 1;
  local_128.compaction_threshold = '\0';
  local_128.block_reusing_threshold = 0;
  pfStack_590 = (fdb_kvs_handle *)0x11b045;
  local_128.multi_kv_instances = multi_kv;
  fdb_open(&local_580,"./mvcc_test6",&local_128);
  local_574 = (int)CONCAT71(in_register_00000039,multi_kv);
  if (local_574 == 0) {
    pfStack_590 = (fdb_kvs_handle *)0x11b0b1;
    fdb_kvs_open_default
              (local_580,(fdb_kvs_handle **)(local_560 + 8),(fdb_kvs_config *)(local_528 + 8));
    pfVar12 = (fdb_kvs_handle *)0x1;
  }
  else {
    ppfVar9 = (fdb_kvs_handle **)(local_560 + 8);
    unaff_R12 = (fdb_kvs_handle *)(local_528 + 8);
    uVar17 = 0;
    do {
      pfStack_590 = (fdb_kvs_handle *)0x11b076;
      sprintf(local_528,"kv%d",uVar17 & 0xffffffff);
      pfStack_590 = (fdb_kvs_handle *)0x11b089;
      fdb_kvs_open(local_580,ppfVar9,local_528,(fdb_kvs_config *)unaff_R12);
      uVar17 = uVar17 + 1;
      ppfVar9 = ppfVar9 + 1;
    } while (uVar17 != 4);
    pfVar12 = (fdb_kvs_handle *)0x4;
    unaff_R13 = (fdb_kvs_handle *)0x4;
  }
  pcVar18 = (char *)0x0;
  __ptr = logCallbackFunc;
  pcVar20 = "rollback_all_test";
  do {
    pfStack_590 = (fdb_kvs_handle *)0x11b0d7;
    fVar2 = fdb_set_log_callback
                      (*(fdb_kvs_handle **)(local_560 + (long)pcVar18 * 8 + 8),logCallbackFunc,
                       "rollback_all_test");
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pfStack_590 = (fdb_kvs_handle *)0x11b7d0;
      rollback_all_test();
      goto LAB_0011b7d0;
    }
    pcVar18 = (char *)((long)&((fdb_txn *)pcVar18)->handle + 1);
  } while (pfVar12 != (fdb_kvs_handle *)pcVar18);
  uVar17 = 0;
  do {
    pfStack_590 = (fdb_kvs_handle *)0x11b106;
    sprintf(local_328,"key%d",uVar17 & 0xffffffff);
    pfStack_590 = (fdb_kvs_handle *)0x11b122;
    sprintf(local_428,"meta%d",uVar17 & 0xffffffff);
    pfStack_590 = (fdb_kvs_handle *)0x11b13e;
    sprintf(local_228,"body%d",uVar17 & 0xffffffff);
    pfStack_590 = (fdb_kvs_handle *)0x11b151;
    sVar5 = strlen(local_328);
    pfStack_590 = (fdb_kvs_handle *)0x11b15c;
    sVar6 = strlen(local_428);
    pfStack_590 = (fdb_kvs_handle *)0x11b167;
    sVar7 = strlen(local_228);
    pfStack_590 = (fdb_kvs_handle *)0x11b18c;
    fdb_doc_create((fdb_doc **)(local_4c8 + uVar17 * 8),local_328,sVar5,local_428,sVar6,local_228,
                   sVar7);
    lVar8 = 0;
    do {
      pfStack_590 = (fdb_kvs_handle *)0x11b19c;
      fdb_set(*(fdb_kvs_handle **)(local_560 + lVar8 * 8 + 8),*(fdb_doc **)(local_4c8 + uVar17 * 8))
      ;
      lVar8 = lVar8 + 1;
    } while (pfVar12 != (fdb_kvs_handle *)lVar8);
    uVar17 = uVar17 + 1;
  } while (uVar17 != 5);
  pfStack_590 = (fdb_kvs_handle *)0x11b1c0;
  fdb_commit(local_580,'\x01');
  uVar17 = 5;
  do {
    pfStack_590 = (fdb_kvs_handle *)0x11b1e2;
    sprintf(local_328,"key%d",uVar17 & 0xffffffff);
    pfStack_590 = (fdb_kvs_handle *)0x11b1fe;
    sprintf(local_428,"meta%d",uVar17 & 0xffffffff);
    pfStack_590 = (fdb_kvs_handle *)0x11b21a;
    sprintf(local_228,"body%d",uVar17 & 0xffffffff);
    pfStack_590 = (fdb_kvs_handle *)0x11b22d;
    sVar5 = strlen(local_328);
    pfStack_590 = (fdb_kvs_handle *)0x11b238;
    sVar6 = strlen(local_428);
    pfStack_590 = (fdb_kvs_handle *)0x11b243;
    sVar7 = strlen(local_228);
    pfStack_590 = (fdb_kvs_handle *)0x11b268;
    fdb_doc_create((fdb_doc **)(local_4c8 + uVar17 * 8),local_328,sVar5,local_428,sVar6,local_228,
                   sVar7);
    lVar8 = 0;
    do {
      pfStack_590 = (fdb_kvs_handle *)0x11b279;
      fdb_set(*(fdb_kvs_handle **)(local_560 + lVar8 * 8 + 8),*(fdb_doc **)(local_4c8 + uVar17 * 8))
      ;
      lVar8 = lVar8 + 1;
    } while (pfVar12 != (fdb_kvs_handle *)lVar8);
    uVar17 = uVar17 + 1;
  } while (uVar17 != 10);
  pfStack_590 = (fdb_kvs_handle *)0x11b29a;
  fdb_commit(local_580,'\0');
  uVar17 = 10;
  do {
    pfStack_590 = (fdb_kvs_handle *)0x11b2bc;
    sprintf(local_328,"key%d",uVar17 & 0xffffffff);
    pfStack_590 = (fdb_kvs_handle *)0x11b2d8;
    sprintf(local_428,"meta%d",uVar17 & 0xffffffff);
    pfStack_590 = (fdb_kvs_handle *)0x11b2f4;
    sprintf(local_228,"body%d",uVar17 & 0xffffffff);
    pfStack_590 = (fdb_kvs_handle *)0x11b307;
    sVar5 = strlen(local_328);
    pfStack_590 = (fdb_kvs_handle *)0x11b312;
    sVar6 = strlen(local_428);
    pfStack_590 = (fdb_kvs_handle *)0x11b31d;
    sVar7 = strlen(local_228);
    pfStack_590 = (fdb_kvs_handle *)0x11b342;
    fdb_doc_create((fdb_doc **)(local_4c8 + uVar17 * 8),local_328,sVar5,local_428,sVar6,local_228,
                   sVar7);
    lVar8 = 0;
    do {
      pfStack_590 = (fdb_kvs_handle *)0x11b353;
      fdb_set(*(fdb_kvs_handle **)(local_560 + lVar8 * 8 + 8),*(fdb_doc **)(local_4c8 + uVar17 * 8))
      ;
      lVar8 = lVar8 + 1;
    } while (pfVar12 != (fdb_kvs_handle *)lVar8);
    uVar17 = uVar17 + 1;
  } while (uVar17 != 0xf);
  pfStack_590 = (fdb_kvs_handle *)0x11b377;
  fdb_commit(local_580,'\x01');
  uVar17 = 0xf;
  do {
    pfStack_590 = (fdb_kvs_handle *)0x11b399;
    sprintf(local_328,"key%d",uVar17 & 0xffffffff);
    pfStack_590 = (fdb_kvs_handle *)0x11b3b5;
    sprintf(local_428,"meta%d",uVar17 & 0xffffffff);
    pfVar21 = (fdb_kvs_handle *)local_228;
    pfStack_590 = (fdb_kvs_handle *)0x11b3d1;
    sprintf((char *)pfVar21,"body%d",uVar17 & 0xffffffff);
    unaff_R12 = (fdb_kvs_handle *)(local_4c8 + uVar17 * 8);
    pfStack_590 = (fdb_kvs_handle *)0x11b3e4;
    sVar5 = strlen(local_328);
    pfStack_590 = (fdb_kvs_handle *)0x11b3ef;
    unaff_R13 = (fdb_kvs_handle *)strlen(local_428);
    pfStack_590 = (fdb_kvs_handle *)0x11b3fa;
    sVar6 = strlen((char *)pfVar21);
    pfStack_590 = (fdb_kvs_handle *)0x11b41f;
    fdb_doc_create((fdb_doc **)unaff_R12,local_328,sVar5,local_428,(size_t)unaff_R13,pfVar21,sVar6);
    pcVar18 = (char *)0x0;
    do {
      pfStack_590 = (fdb_kvs_handle *)0x11b430;
      fdb_set(*(fdb_kvs_handle **)(local_560 + (long)pcVar18 * 8 + 8),
              *(fdb_doc **)&unaff_R12->kvs_config);
      pcVar18 = (char *)((long)pcVar18 + 1);
    } while (pfVar12 != (fdb_kvs_handle *)pcVar18);
    uVar17 = uVar17 + 1;
  } while (uVar17 != 0x14);
  pfStack_590 = (fdb_kvs_handle *)0x11b451;
  fdb_commit(local_580,'\0');
  pfStack_590 = (fdb_kvs_handle *)0x11b465;
  fVar2 = fdb_get_all_snap_markers
                    (local_580,(fdb_snapshot_info_t **)&local_568,(uint64_t *)&local_570);
  pcVar20 = (char *)0x14;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b7f6;
  if ((char)local_574 == '\0') {
    if (local_570 != (fdb_kvs_handle *)0x4) {
      pfStack_590 = (fdb_kvs_handle *)0x11b49b;
      rollback_all_test();
    }
  }
  else if (local_570 != (fdb_kvs_handle *)0x8) {
    pfStack_590 = (fdb_kvs_handle *)0x11b489;
    rollback_all_test();
  }
  pfStack_590 = (fdb_kvs_handle *)0x11b4ae;
  fVar2 = fdb_rollback_all(local_580,(fdb_snapshot_marker_t)local_568->kvs);
  if ((char)local_574 == '\0') {
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b7fb;
LAB_0011b5f4:
    unaff_R12 = (fdb_kvs_handle *)0x0;
    unaff_R13 = (fdb_kvs_handle *)local_560;
    pcVar20 = (char *)&local_530;
    do {
      pfStack_590 = (fdb_kvs_handle *)0x11b613;
      fVar2 = fdb_get_kvs_info(*(fdb_kvs_handle **)(local_560 + (long)unaff_R12 * 8 + 8),&local_508)
      ;
      __ptr = (code *)pfVar21;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b7d5;
      if ((hbtrie *)local_508.last_seqnum != (hbtrie *)0xf) {
        pfStack_590 = (fdb_kvs_handle *)0x11b6c7;
        rollback_all_test();
      }
      if ((filemgr_ops *)local_508.doc_count != (filemgr_ops *)0xf) {
        pfStack_590 = (fdb_kvs_handle *)0x11b6d9;
        rollback_all_test();
      }
      pfStack_590 = (fdb_kvs_handle *)0x11b64b;
      fVar2 = fdb_get(*(fdb_kvs_handle **)(local_560 + (long)unaff_R12 * 8 + 8),
                      (fdb_doc *)local_4c8._152_8_);
      if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0011b7d0;
      pfStack_590 = (fdb_kvs_handle *)0x11b673;
      fVar2 = fdb_get_kv(*(fdb_kvs_handle **)(local_560 + (long)unaff_R12 * 8 + 8),
                         *(_func_cs_off_t_int **)(local_4c8._0_8_ + 0x20),
                         (size_t)*(_func_int_char_ptr_int_mode_t **)local_4c8._0_8_,
                         (void **)unaff_R13,(size_t *)pcVar20);
      __ptr = (code *)local_560._0_8_;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b7e2;
      pcVar18 = *(char **)(local_4c8._0_8_ + 0x40);
      pfStack_590 = (fdb_kvs_handle *)0x11b69c;
      iVar3 = bcmp(pcVar18,(void *)local_560._0_8_,local_530._M_i);
      if (iVar3 != 0) goto LAB_0011b7da;
      pfStack_590 = (fdb_kvs_handle *)0x11b6ac;
      free(__ptr);
      unaff_R12 = (fdb_kvs_handle *)&(unaff_R12->kvs_config).field_0x1;
      pfVar21 = (fdb_kvs_handle *)__ptr;
    } while (pfVar12 != unaff_R12);
    pfVar21 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_590 = (fdb_kvs_handle *)0x11b6f2;
      fVar2 = fdb_set(*(fdb_kvs_handle **)(local_560 + (long)pfVar21 * 8 + 8),
                      (fdb_doc *)local_4c8._0_8_);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b7e7;
      pfVar21 = (fdb_kvs_handle *)&(pfVar21->kvs_config).field_0x1;
    } while (pfVar12 != pfVar21);
    pfStack_590 = (fdb_kvs_handle *)0x11b711;
    fVar2 = fdb_commit(local_580,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b800;
    pfStack_590 = (fdb_kvs_handle *)0x11b723;
    fdb_close(local_580);
    lVar8 = 0;
    do {
      pfStack_590 = (fdb_kvs_handle *)0x11b732;
      fdb_doc_free(*(fdb_doc **)(local_4c8 + lVar8 * 8));
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x14);
    pfStack_590 = (fdb_kvs_handle *)0x11b74a;
    fVar2 = fdb_free_snap_markers((fdb_snapshot_info_t *)local_568,(uint64_t)local_570);
    pfVar21 = (fdb_kvs_handle *)0x14;
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_590 = (fdb_kvs_handle *)0x11b757;
      fdb_shutdown();
      pfStack_590 = (fdb_kvs_handle *)0x11b75c;
      memleak_end();
      pcVar20 = "single kv mode:";
      if ((char)local_574 != '\0') {
        pcVar20 = "multiple kv mode:";
      }
      pfStack_590 = (fdb_kvs_handle *)0x11b78c;
      sprintf(local_228,"rollback all test %s",pcVar20);
      pcVar20 = "%s PASSED\n";
      if (rollback_all_test(bool)::__test_pass != '\0') {
        pcVar20 = "%s FAILED\n";
      }
      pfStack_590 = (fdb_kvs_handle *)0x11b7b9;
      fprintf(_stderr,pcVar20,local_228);
      return;
    }
    goto LAB_0011b805;
  }
  if (fVar2 != FDB_RESULT_KV_STORE_BUSY) goto LAB_0011b80a;
  pfVar21 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_590 = (fdb_kvs_handle *)0x11b4ce;
    fdb_kvs_close(*(fdb_kvs_handle **)(local_560 + (long)pfVar21 * 8 + 8));
    pfVar21 = (fdb_kvs_handle *)((long)pfVar21 + 1);
  } while (pfVar12 != pfVar21);
  pfStack_590 = (fdb_kvs_handle *)0x11b4f2;
  fVar2 = fdb_open((fdb_file_handle **)&local_508,"./mvcc_test6",&local_128);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b80f;
  pfStack_590 = (fdb_kvs_handle *)0x11b518;
  fVar2 = fdb_kvs_open((fdb_file_handle *)local_508.name,(fdb_kvs_handle **)local_560,"kv0",
                       (fdb_kvs_config *)(local_528 + 8));
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b814;
  pfStack_590 = (fdb_kvs_handle *)0x11b533;
  fVar2 = fdb_rollback_all(local_580,(fdb_snapshot_marker_t)local_568->kvs);
  if (fVar2 != FDB_RESULT_KV_STORE_BUSY) goto LAB_0011b819;
  pfStack_590 = (fdb_kvs_handle *)0x11b546;
  fVar2 = fdb_kvs_close((fdb_kvs_handle *)local_560._0_8_);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b81e;
  pfStack_590 = (fdb_kvs_handle *)0x11b55b;
  fVar2 = fdb_close((fdb_file_handle *)local_508.name);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_590 = (fdb_kvs_handle *)0x11b576;
    fVar2 = fdb_rollback_all(local_580,(fdb_snapshot_marker_t)local_568->kvs);
    unaff_R13 = (fdb_kvs_handle *)(local_560 + 8);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcVar20 = local_528;
      pcVar18 = "rollback_all_test";
      pfVar21 = (fdb_kvs_handle *)0x0;
      unaff_R12 = pfVar12;
      do {
        pfStack_590 = (fdb_kvs_handle *)0x11b5a7;
        sprintf(pcVar20,"kv%d",pfVar21);
        pfStack_590 = (fdb_kvs_handle *)0x11b5bc;
        fVar2 = fdb_kvs_open(local_580,(fdb_kvs_handle **)unaff_R13,pcVar20,
                             (fdb_kvs_config *)(local_528 + 8));
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b7f1;
        pfStack_590 = (fdb_kvs_handle *)0x11b5d7;
        fVar2 = fdb_set_log_callback
                          (*(fdb_kvs_handle **)&unaff_R13->kvs_config,logCallbackFunc,
                           "rollback_all_test");
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b7ec;
        pfVar21 = (fdb_kvs_handle *)(ulong)((int)pfVar21 + 1);
        unaff_R13 = (fdb_kvs_handle *)&(unaff_R13->kvs_config).custom_cmp;
        unaff_R12 = (fdb_kvs_handle *)((long)&unaff_R12[-1].bub_ctx.handle + 7);
      } while (unaff_R12 != (fdb_kvs_handle *)0x0);
      goto LAB_0011b5f4;
    }
    goto LAB_0011b7fb;
  }
  goto LAB_0011b823;
LAB_0011bfab:
  pfStack_a38 = (fdb_kvs_handle *)0x11bfb0;
  rollback_during_ops_test();
LAB_0011bfb0:
  pfStack_a38 = (fdb_kvs_handle *)0x11bfb5;
  rollback_during_ops_test();
  goto LAB_0011bfb5;
LAB_0011c3a8:
  pfStack_bf0 = (fdb_kvs_handle *)0x11c3ad;
  in_memory_snapshot_rollback_test();
  goto LAB_0011c3ad;
LAB_0011c7bd:
  pcStack_30a8 = (code *)0x11c7c2;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7c2:
  pcStack_30a8 = (code *)0x11c7c7;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7c7:
  pcStack_30a8 = (code *)0x11c7cc;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7cc:
  pcStack_30a8 = (code *)0x11c7d1;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7d1:
  pcStack_30a8 = (code *)0x11c7d6;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7d6:
  pcStack_30a8 = (code *)0x11c7db;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7db:
  pcStack_30a8 = (code *)0x11c7e0;
  rollback_drop_multi_files_kvs_test();
  goto LAB_0011c7e0;
LAB_0011cd0f:
  pcStack_35b0 = (code *)0x11cd14;
  rollback_without_seqtree();
  goto LAB_0011cd14;
LAB_0011d0a5:
  pfStack_3788 = (fdb_kvs_handle *)0x11d0aa;
  tx_crash_recover_test();
LAB_0011d0aa:
  pfStack_3788 = (fdb_kvs_handle *)0x11d0af;
  tx_crash_recover_test();
  goto LAB_0011d0af;
LAB_0011b7d0:
  pfStack_590 = (fdb_kvs_handle *)0x11b7d5;
  rollback_all_test();
LAB_0011b7d5:
  pfStack_590 = (fdb_kvs_handle *)0x11b7da;
  rollback_all_test();
LAB_0011b7da:
  pfStack_590 = (fdb_kvs_handle *)0x11b7e2;
  rollback_all_test();
  pfVar21 = (fdb_kvs_handle *)__ptr;
LAB_0011b7e2:
  pfStack_590 = (fdb_kvs_handle *)0x11b7e7;
  rollback_all_test();
LAB_0011b7e7:
  pfStack_590 = (fdb_kvs_handle *)0x11b7ec;
  rollback_all_test();
LAB_0011b7ec:
  pfStack_590 = (fdb_kvs_handle *)0x11b7f1;
  rollback_all_test();
LAB_0011b7f1:
  pfStack_590 = (fdb_kvs_handle *)0x11b7f6;
  rollback_all_test();
LAB_0011b7f6:
  pfStack_590 = (fdb_kvs_handle *)0x11b7fb;
  rollback_all_test();
LAB_0011b7fb:
  pfStack_590 = (fdb_kvs_handle *)0x11b800;
  rollback_all_test();
LAB_0011b800:
  pfStack_590 = (fdb_kvs_handle *)0x11b805;
  rollback_all_test();
LAB_0011b805:
  pfStack_590 = (fdb_kvs_handle *)0x11b80a;
  rollback_all_test();
LAB_0011b80a:
  pfStack_590 = (fdb_kvs_handle *)0x11b80f;
  rollback_all_test();
LAB_0011b80f:
  pfStack_590 = (fdb_kvs_handle *)0x11b814;
  rollback_all_test();
LAB_0011b814:
  pfStack_590 = (fdb_kvs_handle *)0x11b819;
  rollback_all_test();
LAB_0011b819:
  pfStack_590 = (fdb_kvs_handle *)0x11b81e;
  rollback_all_test();
LAB_0011b81e:
  pfStack_590 = (fdb_kvs_handle *)0x11b823;
  rollback_all_test();
LAB_0011b823:
  pfStack_590 = (fdb_kvs_handle *)auto_compaction_snapshots_test;
  rollback_all_test();
  pfStack_788 = (fdb_kvs_handle *)0x11b845;
  pfStack_5b8 = pfVar21;
  pfStack_5b0 = unaff_R12;
  pfStack_5a8 = unaff_R13;
  pfStack_5a0 = (fdb_txn *)pcVar18;
  pfStack_598 = (fdb_kvs_handle *)pcVar20;
  pfStack_590 = pfVar12;
  gettimeofday(&tStack_710,(__timezone_ptr_t)0x0);
  pfStack_788 = (fdb_kvs_handle *)0x11b84a;
  memleak_start();
  pfVar19 = (filemgr_ops *)auStack_754;
  auStack_754._0_4_ = 0;
  pfStack_788 = (fdb_kvs_handle *)0x11b862;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar21 = (fdb_kvs_handle *)&stack0xfffffffffffff950;
  pfStack_788 = (fdb_kvs_handle *)0x11b872;
  fdb_get_default_config();
  uStack_682 = 1;
  uStack_690 = 1;
  pcStack_658 = compaction_cb_count;
  auStack_650[0] = ' ';
  auStack_650[1] = '\0';
  auStack_650[2] = '\0';
  auStack_650[3] = '\0';
  pbStack_678 = (btree *)0x1;
  pfVar15 = (fdb_kvs_handle *)0x155054;
  pfStack_788 = (fdb_kvs_handle *)0x11b8ac;
  pfStack_648 = pfVar19;
  fVar2 = fdb_open(&pfStack_760,"mvcc_test1",(fdb_config *)pfVar21);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfVar21 = (fdb_kvs_handle *)(auStack_754 + 4);
    pfStack_788 = (fdb_kvs_handle *)0x11b8c1;
    fdb_get_default_kvs_config();
    _Stack_6f0 = aStack_740.super___atomic_base<unsigned_long>._M_i;
    _Stack_700._M_i = auStack_754._4_8_;
    pkStack_6f8 = pkStack_748;
    pfVar15 = (fdb_kvs_handle *)&pfStack_768;
    pfStack_788 = (fdb_kvs_handle *)0x11b8e6;
    fVar2 = fdb_kvs_open_default
                      (pfStack_760,(fdb_kvs_handle **)pfVar15,(fdb_kvs_config *)&_Stack_700);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bbcd;
    unaff_R13 = (fdb_kvs_handle *)0x155958;
    unaff_R12 = (fdb_kvs_handle *)0x0;
    do {
      pcVar20 = (char *)0xcccccccd;
      pfVar13 = (fdb_kvs_handle *)0x1555bd;
      pfVar15 = (fdb_kvs_handle *)(auStack_754 + 4);
      iVar3 = (int)unaff_R12;
      pfStack_788 = (fdb_kvs_handle *)0x11b91a;
      sprintf((char *)pfVar15,"%d",unaff_R12);
      pfVar12 = pfStack_768;
      pfStack_788 = (fdb_kvs_handle *)0x11b927;
      sVar5 = strlen((char *)pfVar15);
      pfStack_788 = (fdb_kvs_handle *)0x11b93e;
      fVar2 = fdb_set_kv(pfVar12,pfVar15,sVar5,"value",5);
      pfVar14 = unaff_R13;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_788 = (fdb_kvs_handle *)0x11bb86;
        auto_compaction_snapshots_test();
LAB_0011bb86:
        pfStack_788 = (fdb_kvs_handle *)0x11bb8b;
        auto_compaction_snapshots_test();
LAB_0011bb8b:
        pfVar21 = pfVar12;
        pfStack_788 = (fdb_kvs_handle *)0x11bb90;
        auto_compaction_snapshots_test();
LAB_0011bb90:
        pfStack_788 = (fdb_kvs_handle *)0x11bb95;
        auto_compaction_snapshots_test();
LAB_0011bb95:
        pfStack_788 = (fdb_kvs_handle *)0x11bb9a;
        auto_compaction_snapshots_test();
        unaff_R13 = pfVar14;
        doc_00 = (fdb_kvs_handle *)pcVar20;
LAB_0011bb9a:
        pfVar14 = unaff_R13;
        unaff_R13 = pfVar13;
        pfStack_788 = (fdb_kvs_handle *)0x11bb9f;
        auto_compaction_snapshots_test();
LAB_0011bb9f:
        pfStack_788 = (fdb_kvs_handle *)0x11bbac;
        auto_compaction_snapshots_test();
LAB_0011bbac:
        pfStack_788 = (fdb_kvs_handle *)0x11bbb9;
        pfVar15 = pfVar21;
        auto_compaction_snapshots_test();
LAB_0011bbb9:
        pfStack_788 = (fdb_kvs_handle *)0x11bbbe;
        auto_compaction_snapshots_test();
        pfVar12 = unaff_R13;
        pcVar20 = (char *)doc_00;
LAB_0011bbbe:
        unaff_R13 = pfVar14;
        pfStack_788 = (fdb_kvs_handle *)0x11bbc3;
        auto_compaction_snapshots_test();
LAB_0011bbc3:
        pfVar19 = (filemgr_ops *)(auStack_754 + 4);
        pfStack_788 = (fdb_kvs_handle *)0x11bbc8;
        auto_compaction_snapshots_test();
        goto LAB_0011bbc8;
      }
      pfVar12 = unaff_R12;
      if ((int)((ulong)unaff_R12 / 10) * 10 == iVar3) {
        pfVar15 = (fdb_kvs_handle *)0x0;
        pfStack_788 = (fdb_kvs_handle *)0x11b96a;
        fVar2 = fdb_commit(pfStack_760,'\0');
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb86;
      }
      pfVar21 = unaff_R12;
      if ((int)((ulong)unaff_R12 / 100) * 100 == iVar3) {
        pfStack_788 = (fdb_kvs_handle *)0x11b99b;
        fVar2 = fdb_get_kvs_info(pfStack_768,&fStack_6e0);
        pfVar21 = (fdb_kvs_handle *)fStack_6e0.last_seqnum;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb8b;
        pfStack_788 = (fdb_kvs_handle *)0x11b9bd;
        fVar2 = fdb_snapshot_open(pfStack_768,&pfStack_770,fStack_6e0.last_seqnum);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb95;
        pfStack_788 = (fdb_kvs_handle *)0x11b9e3;
        fdb_doc_create((fdb_doc **)&pfStack_778,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
        pfStack_778->fhandle = (fdb_file_handle *)pfVar21;
        pfStack_788 = (fdb_kvs_handle *)0x11b9f6;
        fVar2 = fdb_get_byseq(pfStack_770,(fdb_doc *)pfStack_778);
        pfVar14 = pfStack_778;
        doc_00 = (fdb_kvs_handle *)pcVar20;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb9a;
        pcVar20 = (char *)pfStack_778->op_stats;
        pfStack_788 = (fdb_kvs_handle *)0x11ba17;
        sVar5 = strlen(auStack_754 + 4);
        pfStack_788 = (fdb_kvs_handle *)0x11ba25;
        iVar4 = bcmp(pcVar20,auStack_754 + 4,sVar5);
        doc_00 = (fdb_kvs_handle *)pcVar20;
        if (iVar4 != 0) goto LAB_0011bb9f;
        pfStack_788 = (fdb_kvs_handle *)0x11ba35;
        fdb_doc_free((fdb_doc *)pfVar14);
        pfStack_788 = (fdb_kvs_handle *)0x11ba3f;
        fVar2 = fdb_kvs_close(pfStack_770);
        pfVar13 = unaff_R13;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb90;
        pfVar15 = (fdb_kvs_handle *)&pfStack_770;
        pfStack_788 = (fdb_kvs_handle *)0x11ba5d;
        fVar2 = fdb_snapshot_open(pfStack_768,(fdb_kvs_handle **)pfVar15,0xffffffffffffffff);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bbb9;
        pfStack_788 = (fdb_kvs_handle *)0x11ba83;
        fdb_doc_create((fdb_doc **)&pfStack_778,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
        pfStack_778->fhandle = (fdb_file_handle *)pfVar21;
        pfStack_788 = (fdb_kvs_handle *)0x11ba96;
        pfVar15 = pfStack_778;
        fVar2 = fdb_get_byseq(pfStack_770,(fdb_doc *)pfStack_778);
        doc_00 = pfStack_778;
        pfVar12 = unaff_R13;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bbbe;
        pfVar21 = (fdb_kvs_handle *)pfStack_778->op_stats;
        pfVar15 = (fdb_kvs_handle *)(auStack_754 + 4);
        pfStack_788 = (fdb_kvs_handle *)0x11bab4;
        sVar5 = strlen((char *)pfVar15);
        pfStack_788 = (fdb_kvs_handle *)0x11bac2;
        iVar4 = bcmp(pfVar21,pfVar15,sVar5);
        if (iVar4 != 0) goto LAB_0011bbac;
        pfStack_788 = (fdb_kvs_handle *)0x11bad2;
        fdb_doc_free((fdb_doc *)doc_00);
        pfStack_788 = (fdb_kvs_handle *)0x11badc;
        fVar2 = fdb_kvs_close(pfStack_770);
        pcVar20 = (char *)0xcccccccd;
        pfVar12 = (fdb_kvs_handle *)0x1555bd;
        if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011baf4;
        goto LAB_0011bbc3;
      }
LAB_0011baf4:
      pfVar19 = (filemgr_ops *)(auStack_754 + 4);
      pcVar20 = (char *)0xcccccccd;
      pfVar12 = (fdb_kvs_handle *)0x1555bd;
      unaff_R12 = (fdb_kvs_handle *)(ulong)(iVar3 + 1U);
    } while (iVar3 + 1U != 100000);
    pfStack_788 = (fdb_kvs_handle *)0x11bb0e;
    fVar2 = fdb_close(pfStack_760);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bbd2;
    pfStack_788 = (fdb_kvs_handle *)0x11bb1b;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_788 = (fdb_kvs_handle *)0x11bb28;
      memleak_end();
      pfStack_788 = (fdb_kvs_handle *)0x11bb42;
      sprintf(auStack_754 + 4,"auto compaction completed %d times with snapshots",
              (ulong)(uint)auStack_754._0_4_);
      pcVar20 = "%s PASSED\n";
      if (auto_compaction_snapshots_test()::__test_pass != '\0') {
        pcVar20 = "%s FAILED\n";
      }
      pfStack_788 = (fdb_kvs_handle *)0x11bb6f;
      fprintf(_stderr,pcVar20,auStack_754 + 4);
      return;
    }
  }
  else {
LAB_0011bbc8:
    pfStack_788 = (fdb_kvs_handle *)0x11bbcd;
    auto_compaction_snapshots_test();
LAB_0011bbcd:
    pfStack_788 = (fdb_kvs_handle *)0x11bbd2;
    auto_compaction_snapshots_test();
LAB_0011bbd2:
    pfStack_788 = (fdb_kvs_handle *)0x11bbd7;
    auto_compaction_snapshots_test();
  }
  pfStack_788 = (fdb_kvs_handle *)compaction_cb_count;
  auto_compaction_snapshots_test();
  pfVar14 = (fdb_kvs_handle *)((ulong)pfVar15 & 0xffffffff);
  __tv = &tStack_7a0;
  pfStack_7b0 = (fdb_kvs_handle *)0x11bbf3;
  pfStack_790 = pfVar21;
  pfStack_788 = pfVar12;
  gettimeofday(__tv,(__timezone_ptr_t)0x0);
  if ((int)pfVar15 == 0x20) {
    if (extraout_RDX == 0) {
      *(int *)&pfStack_778->kvs_config = *(int *)&pfStack_778->kvs_config + 1;
      return;
    }
  }
  else {
    pfStack_7b0 = (fdb_kvs_handle *)0x11bc12;
    compaction_cb_count();
  }
  pfStack_7b0 = (fdb_kvs_handle *)rollback_during_ops_test;
  compaction_cb_count();
  pfStack_a38 = (fdb_kvs_handle *)0x11bc37;
  pfStack_7d0 = unaff_R12;
  pfStack_7c8 = unaff_R13;
  pfStack_7c0 = pfVar19;
  pfStack_7b8 = (fdb_kvs_handle *)pcVar20;
  pfStack_7b0 = pfVar14;
  gettimeofday((timeval *)(auStack_a07 + 0x2f),(__timezone_ptr_t)0x0);
  pfStack_a38 = (fdb_kvs_handle *)0x11bc3c;
  memleak_start();
  uStack_a14 = 10000;
  if (__tv == (timeval *)0x0) {
    pfStack_a38 = (fdb_kvs_handle *)0x11bc59;
    system("rm -rf  mvcc_test* > errorlog.txt");
    pfStack_a38 = (fdb_kvs_handle *)0x11bc66;
    fdb_get_default_config();
    fconfig_01 = &fStack_8d0;
    pfStack_a38 = (fdb_kvs_handle *)0x11bc7e;
    memcpy(fconfig_01,auStack_9c8,0xf8);
    fStack_8d0.block_reusing_threshold = 0;
    pfStack_a38 = (fdb_kvs_handle *)0x11bc9d;
    fVar2 = fdb_open(&pfStack_a20,"mvcc_test1",fconfig_01);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_a38 = (fdb_kvs_handle *)0x11bcb2;
      fdb_get_default_kvs_config();
      auStack_a07._39_8_ = uStack_9b8;
      auStack_a07._23_8_ = auStack_9c8._0_8_;
      auStack_a07._31_8_ = auStack_9c8._8_8_;
      pfStack_a38 = (fdb_kvs_handle *)0x11bcd4;
      fVar2 = fdb_kvs_open_default(pfStack_a20,&pfStack_a28,(fdb_kvs_config *)(auStack_a07 + 0x17));
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0df;
      unaff_R13 = (fdb_kvs_handle *)CONCAT71((int7)((ulong)unaff_R13 >> 8),1);
      __tv = (timeval *)0x1;
      uVar11 = 0;
      do {
        uVar10 = uVar11 + 1;
        pfVar14 = (fdb_kvs_handle *)(ulong)uVar10;
        pfStack_a38 = (fdb_kvs_handle *)0x11bd03;
        sprintf(auStack_a07,"%d",pfVar14);
        unaff_R12 = pfStack_a28;
        pfStack_a38 = (fdb_kvs_handle *)0x11bd10;
        sVar5 = strlen(auStack_a07);
        pfStack_a38 = (fdb_kvs_handle *)0x11bd2b;
        fVar2 = fdb_set_kv(unaff_R12,auStack_a07,sVar5,"value",5);
        if (fVar2 != FDB_RESULT_SUCCESS) {
          pfStack_a38 = (fdb_kvs_handle *)0x11bfab;
          rollback_during_ops_test();
          goto LAB_0011bfab;
        }
        if ((int)((ulong)__tv / 10) * 10 - 1U == uVar11) {
          unaff_R13 = (fdb_kvs_handle *)((ulong)unaff_R13 ^ 1);
          pfStack_a38 = (fdb_kvs_handle *)0x11bd66;
          fdb_commit(pfStack_a20,(fdb_commit_opt_t)unaff_R13);
        }
        __tv = (timeval *)(ulong)((int)__tv + 1);
        uVar11 = uVar10;
      } while (uVar10 < 10000);
      pfVar14 = (fdb_kvs_handle *)0x1;
      pfStack_a38 = (fdb_kvs_handle *)0x11bd8b;
      fdb_commit(pfStack_a20,'\x01');
      pfStack_a38 = (fdb_kvs_handle *)0x11bd9a;
      fdb_get_kvs_info(pfStack_a28,(fdb_kvs_info *)auStack_9c8);
      __tv = (timeval *)(auStack_9c8 + 8);
      if ((fdb_config *)auStack_9c8._8_8_ != (fdb_config *)0x2710) {
        pfStack_a38 = (fdb_kvs_handle *)0x11bdb0;
        rollback_during_ops_test();
      }
      pfStack_a38 = (fdb_kvs_handle *)0x11bdc8;
      pthread_create(&pStack_a10,(pthread_attr_t *)0x0,rollback_during_ops_test,&uStack_a14);
      fconfig_01 = (fdb_config *)0x155958;
      pcVar20 = auStack_a07;
      unaff_R12 = (fdb_kvs_handle *)0x1555bd;
      do {
        pfStack_a38 = (fdb_kvs_handle *)0x11bdea;
        sprintf(pcVar20,"%d",pfVar14);
        unaff_R13 = pfStack_a28;
        pfStack_a38 = (fdb_kvs_handle *)0x11bdf7;
        sVar5 = strlen(pcVar20);
        pfStack_a38 = (fdb_kvs_handle *)0x11be0e;
        fVar2 = fdb_set_kv(unaff_R13,pcVar20,sVar5,"value",5);
        if (fVar2 != FDB_RESULT_FAIL_BY_ROLLBACK) {
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfab;
          pfStack_a38 = (fdb_kvs_handle *)0x11be2a;
          fVar2 = fdb_commit(pfStack_a20,'\x01');
          if ((fVar2 != FDB_RESULT_FAIL_BY_ROLLBACK) && (fVar2 != FDB_RESULT_SUCCESS))
          goto LAB_0011bfb0;
        }
        uVar11 = (int)pfVar14 + 1;
        pfVar14 = (fdb_kvs_handle *)(ulong)uVar11;
      } while (uVar11 != 0x2711);
      pfStack_a38 = (fdb_kvs_handle *)0x11be50;
      pthread_join(pStack_a10,(void **)(auStack_a07 + 0xf));
      pfStack_a38 = (fdb_kvs_handle *)0x11be73;
      fVar2 = fdb_set_kv(pfStack_a28,"key1",4,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0e4;
      pfStack_a38 = (fdb_kvs_handle *)0x11be8a;
      fVar2 = fdb_commit(pfStack_a20,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0e9;
      pfStack_a38 = (fdb_kvs_handle *)0x11bea4;
      fdb_get_kvs_info(pfStack_a28,(fdb_kvs_info *)auStack_9c8);
      fconfig_01 = (fdb_config *)auStack_9c8._8_8_;
      pfStack_a38 = (fdb_kvs_handle *)0x11becb;
      fVar2 = fdb_set_kv(pfStack_a28,"key2",4,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0ee;
      pfStack_a38 = (fdb_kvs_handle *)0x11bef6;
      fVar2 = fdb_set_kv(pfStack_a28,"key3",4,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0f3;
      pfStack_a38 = (fdb_kvs_handle *)0x11bf0d;
      fVar2 = fdb_commit(pfStack_a20,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0f8;
      pfStack_a38 = (fdb_kvs_handle *)0x11bf22;
      fVar2 = fdb_rollback(&pfStack_a28,(fdb_seqnum_t)fconfig_01);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        pfStack_a38 = (fdb_kvs_handle *)0x11bf3c;
        fdb_get_kvs_info(pfStack_a28,(fdb_kvs_info *)auStack_9c8);
        if ((fdb_config *)auStack_9c8._8_8_ != fconfig_01) {
          pfStack_a38 = (fdb_kvs_handle *)0x11bf4d;
          rollback_during_ops_test();
        }
        pfStack_a38 = (fdb_kvs_handle *)0x11bf57;
        fdb_close(pfStack_a20);
        pfStack_a38 = (fdb_kvs_handle *)0x11bf5c;
        fdb_shutdown();
        pfStack_a38 = (fdb_kvs_handle *)0x11bf61;
        memleak_end();
        pcVar20 = "%s PASSED\n";
        if (rollback_during_ops_test(void*)::__test_pass != '\0') {
          pcVar20 = "%s FAILED\n";
        }
        pfStack_a38 = (fdb_kvs_handle *)0x11bf92;
        fprintf(_stderr,pcVar20,"rollback during ops test");
        return;
      }
    }
    else {
      pfStack_a38 = (fdb_kvs_handle *)0x11c0df;
      rollback_during_ops_test();
LAB_0011c0df:
      __tv = (timeval *)auStack_9c8;
      pfStack_a38 = (fdb_kvs_handle *)0x11c0e4;
      rollback_during_ops_test();
LAB_0011c0e4:
      pfStack_a38 = (fdb_kvs_handle *)0x11c0e9;
      rollback_during_ops_test();
LAB_0011c0e9:
      pfStack_a38 = (fdb_kvs_handle *)0x11c0ee;
      rollback_during_ops_test();
LAB_0011c0ee:
      pfStack_a38 = (fdb_kvs_handle *)0x11c0f3;
      rollback_during_ops_test();
LAB_0011c0f3:
      pfStack_a38 = (fdb_kvs_handle *)0x11c0f8;
      rollback_during_ops_test();
LAB_0011c0f8:
      pfStack_a38 = (fdb_kvs_handle *)0x11c0fd;
      rollback_during_ops_test();
    }
    pfStack_a38 = (fdb_kvs_handle *)0x11c102;
    rollback_during_ops_test();
LAB_0011c102:
    pfStack_a38 = (fdb_kvs_handle *)0x11c107;
    rollback_during_ops_test();
  }
  else {
LAB_0011bfb5:
    fconfig_01 = (fdb_config *)auStack_9c8;
    pfStack_a38 = (fdb_kvs_handle *)0x11bfc2;
    fdb_get_default_config();
    pcVar20 = (char *)&fStack_8d0;
    pfStack_a38 = (fdb_kvs_handle *)0x11bfda;
    memcpy(pcVar20,fconfig_01,0xf8);
    fStack_8d0.block_reusing_threshold = 0;
    pfStack_a38 = (fdb_kvs_handle *)0x11bff9;
    fVar2 = fdb_open(&pfStack_a20,"mvcc_test1",(fdb_config *)pcVar20);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c102;
    fconfig_01 = (fdb_config *)auStack_9c8;
    pfStack_a38 = (fdb_kvs_handle *)0x11c00e;
    fdb_get_default_kvs_config();
    auStack_a07._39_8_ = uStack_9b8;
    auStack_a07._23_8_ = auStack_9c8._0_8_;
    auStack_a07._31_8_ = auStack_9c8._8_8_;
    pfStack_a38 = (fdb_kvs_handle *)0x11c031;
    fVar2 = fdb_kvs_open_default(pfStack_a20,&pfStack_a28,(fdb_kvs_config *)(auStack_a07 + 0x17));
    if (fVar2 == FDB_RESULT_SUCCESS) {
      __tv = (timeval *)(long)(int)__tv->tv_sec;
      if (1 < (long)__tv) {
        unaff_R13 = (fdb_kvs_handle *)0xcccccccd;
        fconfig_01 = (fdb_config *)0x155958;
        pcVar20 = auStack_a07;
        unaff_R12 = (fdb_kvs_handle *)0x1555bd;
        do {
          pfStack_a38 = (fdb_kvs_handle *)0x11c06e;
          sprintf(pcVar20,"%d",(ulong)__tv & 0xffffffff);
          pfVar14 = pfStack_a28;
          pfStack_a38 = (fdb_kvs_handle *)0x11c07b;
          sVar5 = strlen(pcVar20);
          pfStack_a38 = (fdb_kvs_handle *)0x11c092;
          fVar2 = fdb_set_kv(pfVar14,pcVar20,sVar5,"value",5);
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c10c;
          if ((int)(((ulong)__tv & 0xffffffff) / 10) * -10 + (int)__tv == 0) {
            pfStack_a38 = (fdb_kvs_handle *)0x11c0b8;
            fVar2 = fdb_rollback(&pfStack_a28,(fdb_seqnum_t)__tv);
            if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c111;
          }
          bVar1 = 2 < (long)__tv;
          __tv = (timeval *)((long)&__tv[-1].tv_usec + 7);
        } while (bVar1);
      }
      pfStack_a38 = (fdb_kvs_handle *)0x11c0d3;
      fdb_close(pfStack_a20);
      pfStack_a38 = (fdb_kvs_handle *)0x11c0da;
      pthread_exit((void *)0x0);
    }
  }
  pfStack_a38 = (fdb_kvs_handle *)0x11c10c;
  rollback_during_ops_test();
LAB_0011c10c:
  pfStack_a38 = (fdb_kvs_handle *)0x11c111;
  rollback_during_ops_test();
LAB_0011c111:
  pfStack_a38 = (fdb_kvs_handle *)in_memory_snapshot_rollback_test;
  rollback_during_ops_test();
  pfStack_bf0 = (fdb_kvs_handle *)0x11c132;
  ptStack_a58 = __tv;
  pfStack_a50 = unaff_R12;
  pfStack_a48 = unaff_R13;
  pfStack_a40 = fconfig_01;
  pfStack_a38 = (fdb_kvs_handle *)pcVar20;
  gettimeofday((timeval *)(auStack_bb7 + 0xf),(__timezone_ptr_t)0x0);
  pfStack_bf0 = (fdb_kvs_handle *)0x11c137;
  memleak_start();
  pfStack_bf0 = (fdb_kvs_handle *)0x11c143;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fconfig_00 = &fStack_b50;
  pfStack_bf0 = (fdb_kvs_handle *)0x11c153;
  fdb_get_default_config();
  pfStack_bf0 = (fdb_kvs_handle *)0x11c167;
  fVar2 = fdb_open(&pfStack_bd8,"mvcc_test1",fconfig_00);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fconfig_00 = (fdb_config *)(auStack_b98 + 0x30);
    pfStack_bf0 = (fdb_kvs_handle *)0x11c17f;
    fdb_get_default_kvs_config();
    pfStack_bf0 = (fdb_kvs_handle *)0x11c191;
    fVar2 = fdb_kvs_open_default(pfStack_bd8,&pfStack_be0,(fdb_kvs_config *)fconfig_00);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3b2;
    fconfig_00 = (fdb_config *)0x1;
    fconfig_01 = (fdb_config *)0x155958;
    pcVar20 = auStack_bb7;
    unaff_R12 = (fdb_kvs_handle *)0x1555bd;
    do {
      pfStack_bf0 = (fdb_kvs_handle *)0x11c1c0;
      sprintf(pcVar20,"%d",fconfig_00);
      unaff_R13 = pfStack_be0;
      pfStack_bf0 = (fdb_kvs_handle *)0x11c1cd;
      sVar5 = strlen(pcVar20);
      pfStack_bf0 = (fdb_kvs_handle *)0x11c1e4;
      fVar2 = fdb_set_kv(unaff_R13,pcVar20,sVar5,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_bf0 = (fdb_kvs_handle *)0x11c3a8;
        in_memory_snapshot_rollback_test();
        goto LAB_0011c3a8;
      }
      uVar11 = (int)fconfig_00 + 1;
      fconfig_00 = (fdb_config *)(ulong)uVar11;
    } while (uVar11 != 4);
    pfStack_bf0 = (fdb_kvs_handle *)0x11c1ff;
    fdb_commit(pfStack_bd8,'\0');
    pfStack_bf0 = (fdb_kvs_handle *)0x11c222;
    fVar2 = fdb_set_kv(pfStack_be0,"key4",4,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3b7;
    pfStack_bf0 = (fdb_kvs_handle *)0x11c24d;
    fVar2 = fdb_set_kv(pfStack_be0,"key5",4,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3bc;
    pfStack_bf0 = (fdb_kvs_handle *)0x11c264;
    fVar2 = fdb_commit(pfStack_bd8,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3c1;
    pfStack_bf0 = (fdb_kvs_handle *)0x11c27b;
    fVar2 = fdb_rollback(&pfStack_be0,3);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3c6;
    fconfig_00 = (fdb_config *)auStack_b98;
    pfStack_bf0 = (fdb_kvs_handle *)0x11c295;
    fdb_get_kvs_info(pfStack_be0,(fdb_kvs_info *)fconfig_00);
    if (auStack_b98._8_8_ != 3) {
      pfStack_bf0 = (fdb_kvs_handle *)0x11c2a6;
      in_memory_snapshot_rollback_test();
    }
    pfStack_bf0 = (fdb_kvs_handle *)0x11c2bc;
    fVar2 = fdb_snapshot_open(pfStack_be0,&pfStack_bc0,0xffffffffffffffff);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3cb;
    pfStack_bf0 = (fdb_kvs_handle *)0x11c2e4;
    fdb_iterator_init(pfStack_bc0,&pfStack_bd0,(void *)0x0,0,(void *)0x0,0,0);
    fconfig_00 = (fdb_config *)&pfStack_bc8;
    pfStack_bc8 = (fdb_doc *)0x0;
    fconfig_01 = (fdb_config *)0x3;
    do {
      pfStack_bf0 = (fdb_kvs_handle *)0x11c303;
      fVar2 = fdb_iterator_get(pfStack_bd0,(fdb_doc **)fconfig_00);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3a8;
      pfStack_bf0 = (fdb_kvs_handle *)0x11c315;
      fdb_doc_free(pfStack_bc8);
      pfStack_bc8 = (fdb_doc *)0x0;
      pfStack_bf0 = (fdb_kvs_handle *)0x11c328;
      fVar2 = fdb_iterator_next(pfStack_bd0);
      fconfig_01 = (fdb_config *)&fconfig_01[-1].field_0xf7;
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    if (fconfig_01 == (fdb_config *)0x0) {
      pfStack_bf0 = (fdb_kvs_handle *)0x11c343;
      fdb_iterator_close(pfStack_bd0);
      pfStack_bf0 = (fdb_kvs_handle *)0x11c34d;
      fdb_kvs_close(pfStack_bc0);
      pfStack_bf0 = (fdb_kvs_handle *)0x11c357;
      fdb_close(pfStack_bd8);
      pfStack_bf0 = (fdb_kvs_handle *)0x11c35c;
      fdb_shutdown();
      pfStack_bf0 = (fdb_kvs_handle *)0x11c361;
      memleak_end();
      pcVar20 = "%s PASSED\n";
      if (in_memory_snapshot_rollback_test()::__test_pass != '\0') {
        pcVar20 = "%s FAILED\n";
      }
      pfStack_bf0 = (fdb_kvs_handle *)0x11c392;
      fprintf(_stderr,pcVar20,"in-memory snapshot rollback test");
      return;
    }
  }
  else {
LAB_0011c3ad:
    pfStack_bf0 = (fdb_kvs_handle *)0x11c3b2;
    in_memory_snapshot_rollback_test();
LAB_0011c3b2:
    pfStack_bf0 = (fdb_kvs_handle *)0x11c3b7;
    in_memory_snapshot_rollback_test();
LAB_0011c3b7:
    pfStack_bf0 = (fdb_kvs_handle *)0x11c3bc;
    in_memory_snapshot_rollback_test();
LAB_0011c3bc:
    pfStack_bf0 = (fdb_kvs_handle *)0x11c3c1;
    in_memory_snapshot_rollback_test();
LAB_0011c3c1:
    pfStack_bf0 = (fdb_kvs_handle *)0x11c3c6;
    in_memory_snapshot_rollback_test();
LAB_0011c3c6:
    pfStack_bf0 = (fdb_kvs_handle *)0x11c3cb;
    in_memory_snapshot_rollback_test();
LAB_0011c3cb:
    pfStack_bf0 = (fdb_kvs_handle *)0x11c3d0;
    in_memory_snapshot_rollback_test();
  }
  pfStack_bf0 = (fdb_kvs_handle *)rollback_drop_multi_files_kvs_test;
  in_memory_snapshot_rollback_test();
  pcStack_30a8 = (code *)0x11c3f2;
  pfStack_c18 = fconfig_00;
  pfStack_c10 = unaff_R12;
  pfStack_c08 = unaff_R13;
  pfStack_c00 = fconfig_01;
  pfStack_bf8 = (fdb_kvs_handle *)pcVar20;
  pfStack_bf0 = pfVar14;
  gettimeofday(&tStack_3030,(__timezone_ptr_t)0x0);
  pcStack_30a8 = (code *)0x11c3f7;
  memleak_start();
  pcStack_30a8 = (code *)0x11c403;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_30a8 = (code *)0x11c413;
  fdb_get_default_config();
  pcStack_30a8 = (code *)0x11c41d;
  fdb_get_default_kvs_config();
  fStack_2f18.wal_threshold = 0x400;
  fStack_2f18.compaction_mode = 0;
  fStack_2f18.durability_opt = 2;
  pfVar12 = (fdb_kvs_handle *)(apfStack_2d20 + 0x20);
  ppfVar9 = apfStack_3020;
  pcVar20 = "kvs%d";
  uVar17 = 0;
  __s = (fdb_kvs_handle **)0x0;
  do {
    pcStack_30a8 = (code *)0x11c45d;
    sprintf((char *)ppfVar9,"mvcc_test%d",(ulong)__s & 0xffffffff);
    pcVar18 = (char *)(apfStack_3090 + (long)__s);
    pcStack_30a8 = (code *)0x11c478;
    ppfVar16 = (fdb_kvs_handle **)pcVar18;
    fVar2 = fdb_open((fdb_file_handle **)pcVar18,(char *)ppfVar9,
                     (fdb_config *)(apfStack_3020 + 0x21));
    iVar3 = (int)ppfVar16;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7c7;
    ppfVar16 = (fdb_kvs_handle **)0x0;
    ppfStack_30a0 = __s;
    pfStack_3098 = pfVar12;
    do {
      __s = ppfVar16;
      pcStack_30a8 = (code *)0x11c49d;
      sprintf((char *)ppfVar9,"kvs%d",(ulong)(uint)((int)__s + (int)uVar17));
      pfVar21 = *(fdb_kvs_handle **)pcVar18;
      pcStack_30a8 = (code *)0x11c4b0;
      fVar2 = fdb_kvs_open((fdb_file_handle *)pfVar21,(fdb_kvs_handle **)pfVar12,(char *)ppfVar9,
                           (fdb_kvs_config *)(apfStack_3090 + 9));
      iVar3 = (int)pfVar21;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pcStack_30a8 = (code *)0x11c7bd;
        rollback_drop_multi_files_kvs_test();
        goto LAB_0011c7bd;
      }
      pfVar12 = (fdb_kvs_handle *)&(pfVar12->kvs_config).custom_cmp;
      ppfVar16 = (fdb_kvs_handle **)((long)__s + 1);
    } while ((char *)((long)__s + 1) != (char *)0x80);
    __s = (fdb_kvs_handle **)((long)ppfStack_30a0 + 1);
    uVar17 = uVar17 + 0x80;
    pfVar12 = (fdb_kvs_handle *)&pfStack_3098[1].bub_ctx.space_used;
  } while (__s != (fdb_kvs_handle **)0x8);
  __s = apfStack_3020 + 0x40;
  ppfVar9 = apfStack_2d20;
  pfVar12 = (fdb_kvs_handle *)0x0;
  do {
    uVar17 = 0;
    do {
      pcStack_30a8 = (code *)0x11c511;
      sprintf((char *)__s,"key%08d",uVar17);
      pcStack_30a8 = (code *)0x11c524;
      sprintf((char *)ppfVar9,"value%08d",uVar17);
      pcVar20 = (char *)apfStack_2d20[(long)&pfVar12->op_stats];
      pcStack_30a8 = (code *)0x11c534;
      sVar5 = strlen((char *)__s);
      pcVar18 = (char *)(sVar5 + 1);
      pcStack_30a8 = (code *)0x11c540;
      sVar5 = strlen((char *)ppfVar9);
      pcStack_30a8 = (code *)0x11c555;
      pfVar21 = (fdb_kvs_handle *)pcVar20;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)pcVar20,__s,(size_t)pcVar18,ppfVar9,sVar5 + 1);
      iVar3 = (int)pfVar21;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7bd;
      uVar11 = (int)uVar17 + 1;
      uVar17 = (ulong)uVar11;
    } while (uVar11 != 10);
    pfVar12 = (fdb_kvs_handle *)&(pfVar12->kvs_config).field_0x1;
  } while (pfVar12 != (fdb_kvs_handle *)0x400);
  pcVar18 = (char *)0x0;
  do {
    pfVar21 = apfStack_3090[(long)pcVar18];
    if (((ulong)pcVar18 & 1) == 0) {
      pcStack_30a8 = (code *)0x11c583;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar21,'\0');
      iVar3 = (int)pfVar21;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7e5;
    }
    else {
      pcStack_30a8 = (code *)0x11c596;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar21,'\x01');
      iVar3 = (int)pfVar21;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7ea;
    }
    pcVar18 = (char *)((long)pcVar18 + 1);
  } while (pcVar18 != (char *)0x8);
  pcVar18 = "key%08d";
  __s = apfStack_3020 + 0x40;
  ppfVar9 = (fdb_kvs_handle **)0x0;
  do {
    uVar17 = 0;
    do {
      pcStack_30a8 = (code *)0x11c5ca;
      sprintf((char *)__s,"key%08d",uVar17);
      pfVar12 = apfStack_2d20[(long)(ppfVar9 + 4)];
      pcStack_30a8 = (code *)0x11c5da;
      sVar5 = strlen((char *)__s);
      pcStack_30a8 = (code *)0x11c5e9;
      pfVar21 = pfVar12;
      fVar2 = fdb_del_kv(pfVar12,__s,sVar5 + 1);
      iVar3 = (int)pfVar21;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7c2;
      uVar11 = (int)uVar17 + 1;
      uVar17 = (ulong)uVar11;
    } while (uVar11 != 10);
    ppfVar9 = (fdb_kvs_handle **)((long)ppfVar9 + 1);
  } while (ppfVar9 != (fdb_kvs_handle **)0x400);
  pcVar18 = (char *)0x0;
  do {
    pfVar21 = apfStack_3090[(long)pcVar18];
    if (((ulong)pcVar18 & 1) == 0) {
      pcStack_30a8 = (code *)0x11c617;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar21,'\0');
      iVar3 = (int)pfVar21;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7ef;
    }
    else {
      pcStack_30a8 = (code *)0x11c62a;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar21,'\x01');
      iVar3 = (int)pfVar21;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7f4;
    }
    pcVar18 = (char *)((long)pcVar18 + 1);
  } while (pcVar18 != (char *)0x8);
  __s = (fdb_kvs_handle **)0xffffffffffffffc0;
  pcVar18 = (char *)(apfStack_2d20 + 0x20);
  do {
    pcStack_30a8 = (code *)0x11c657;
    ppfVar16 = (fdb_kvs_handle **)pcVar18;
    fVar2 = fdb_rollback((fdb_kvs_handle **)pcVar18,10);
    iVar3 = (int)ppfVar16;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7cc;
    __s = __s + 8;
    pcVar18 = (char *)((long)pcVar18 + 0x200);
  } while (__s < (fdb_kvs_handle **)0x3c0);
  ppfVar9 = apfStack_3090;
  pcVar18 = "kvs%d";
  __s = apfStack_3020;
  pfVar12 = (fdb_kvs_handle *)0x0;
  do {
    pfVar21 = apfStack_2d20[(long)&pfVar12->op_stats];
    pcStack_30a8 = (code *)0x11c697;
    fVar2 = fdb_kvs_close(pfVar21);
    iVar3 = (int)pfVar21;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7d6;
    pcStack_30a8 = (code *)0x11c6af;
    sprintf((char *)__s,"kvs%d",(ulong)pfVar12 & 0xffffffff);
    pfVar21 = *ppfVar9;
    pcStack_30a8 = (code *)0x11c6bb;
    fVar2 = fdb_kvs_remove((fdb_file_handle *)pfVar21,(char *)__s);
    iVar3 = (int)pfVar21;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7d1;
    pfVar12 = (fdb_kvs_handle *)&(pfVar12->config).wal_threshold;
    ppfVar9 = ppfVar9 + 1;
  } while (pfVar12 != (fdb_kvs_handle *)0x400);
  pcVar18 = (char *)0x0;
  do {
    pfVar21 = apfStack_3090[(long)pcVar18];
    if (((ulong)pcVar18 & 1) == 0) {
      pcStack_30a8 = (code *)0x11c6e7;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar21,'\0');
      iVar3 = (int)pfVar21;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7f9;
    }
    else {
      pcStack_30a8 = (code *)0x11c6fa;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar21,'\x01');
      iVar3 = (int)pfVar21;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7fe;
    }
    pcVar18 = (char *)((long)pcVar18 + 1);
  } while (pcVar18 != (char *)0x8);
  pcVar18 = "mvcc_test_compact%d";
  __s = apfStack_3020;
  pfVar12 = (fdb_kvs_handle *)0x0;
  do {
    pcStack_30a8 = (code *)0x11c72d;
    sprintf((char *)__s,"mvcc_test_compact%d",(ulong)pfVar12 & 0xffffffff);
    pfVar21 = apfStack_3090[(long)pfVar12];
    pcStack_30a8 = (code *)0x11c73a;
    fVar2 = fdb_compact((fdb_file_handle *)pfVar21,(char *)__s);
    iVar3 = (int)pfVar21;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7db;
    pfVar12 = (fdb_kvs_handle *)&(pfVar12->kvs_config).field_0x1;
  } while (pfVar12 != (fdb_kvs_handle *)0x8);
  pcVar18 = (char *)0x0;
  pcStack_30a8 = (code *)0x11c754;
  fdb_doc_free((fdb_doc *)0x0);
  while( true ) {
    pfVar21 = apfStack_3090[(long)pcVar18];
    pcStack_30a8 = (code *)0x11c75e;
    fVar2 = fdb_close((fdb_file_handle *)pfVar21);
    iVar3 = (int)pfVar21;
    if (fVar2 != FDB_RESULT_SUCCESS) break;
    pcVar18 = (char *)((long)pcVar18 + 1);
    if (pcVar18 == (char *)0x8) {
      pcStack_30a8 = (code *)0x11c770;
      fdb_shutdown();
      pcStack_30a8 = (code *)0x11c775;
      memleak_end();
      pcVar20 = "%s PASSED\n";
      if (rollback_drop_multi_files_kvs_test()::__test_pass != '\0') {
        pcVar20 = "%s FAILED\n";
      }
      pcStack_30a8 = (code *)0x11c7a6;
      fprintf(_stderr,pcVar20,"open multi files kvs test");
      return;
    }
  }
LAB_0011c7e0:
  pcStack_30a8 = (code *)0x11c7e5;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7e5:
  pcStack_30a8 = (code *)0x11c7ea;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7ea:
  pcStack_30a8 = (code *)0x11c7ef;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7ef:
  pcStack_30a8 = (code *)0x11c7f4;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7f4:
  pcStack_30a8 = (code *)0x11c7f9;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7f9:
  pcStack_30a8 = (code *)0x11c7fe;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7fe:
  pcStack_30a8 = rollback_without_seqtree;
  rollback_drop_multi_files_kvs_test();
  pcStack_35b0 = (code *)0x11c825;
  ppfStack_30d0 = (fdb_kvs_handle **)pcVar18;
  ppfStack_30c8 = ppfVar9;
  pfStack_30c0 = (fdb_kvs_handle *)pcVar20;
  ppfStack_30b8 = __s;
  pfStack_30b0 = pfVar12;
  pcStack_30a8 = (code *)uVar17;
  gettimeofday(&tStack_3528,(__timezone_ptr_t)0x0);
  pcStack_35b0 = (code *)0x11c82a;
  memleak_start();
  pcStack_35b0 = (code *)0x11c83a;
  fdb_get_default_config();
  pcStack_35b0 = (code *)0x11c844;
  fdb_get_default_kvs_config();
  fStack_31c8.flags = 1;
  fStack_31c8.block_reusing_threshold = 0;
  fStack_31c8.seqtree_opt = 0;
  pcStack_35b0 = (code *)0x11c86a;
  fStack_31c8.multi_kv_instances = (bool)(char)iVar3;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_35b0 = (code *)0x11c87e;
  fdb_open((fdb_file_handle **)&pfStack_3598,"./mvcc_test1",(fdb_config *)(acStack_32c8 + 0x100));
  iStack_3574 = iVar3;
  if (iVar3 == 0) {
    pcStack_35b0 = (code *)0x11c8ea;
    fdb_kvs_open_default((fdb_file_handle *)pfStack_3598,apfStack_3568,&fStack_3548);
    pcVar20 = (char *)0x1;
  }
  else {
    ppfVar9 = apfStack_3568;
    uVar17 = 0;
    do {
      pcStack_35b0 = (code *)0x11c8af;
      sprintf(acStack_3530,"kv%d",uVar17 & 0xffffffff);
      pcStack_35b0 = (code *)0x11c8c2;
      fdb_kvs_open((fdb_file_handle *)pfStack_3598,ppfVar9,acStack_3530,&fStack_3548);
      uVar17 = uVar17 + 1;
      ppfVar9 = ppfVar9 + 1;
    } while (uVar17 != 3);
    pcVar20 = (char *)0x3;
  }
  uStack_359c = 0;
  do {
    uVar17 = 0;
    do {
      pcStack_35b0 = (code *)0x11c916;
      sprintf(acStack_33c8,"key%d",uVar17 & 0xffffffff);
      pcStack_35b0 = (code *)0x11c937;
      sprintf(acStack_3518,"meta-%d-%d",(ulong)uStack_359c,uVar17 & 0xffffffff);
      pcStack_35b0 = (code *)0x11c956;
      sprintf(acStack_32c8,"body-%d-%d",(ulong)uStack_359c,uVar17 & 0xffffffff);
      doc = (btree *)(&bStack_3418.ksize + uVar17 * 8);
      pcStack_35b0 = (code *)0x11c969;
      sVar5 = strlen(acStack_33c8);
      pcStack_35b0 = (code *)0x11c979;
      metalen._M_i = strlen(acStack_3518);
      pcStack_35b0 = (code *)0x11c984;
      sVar6 = strlen(acStack_32c8);
      pcStack_35b0 = (code *)0x11c9a9;
      fdb_doc_create((fdb_doc **)doc,acStack_33c8,sVar5,acStack_3518,metalen._M_i,acStack_32c8,sVar6
                    );
      pfVar12 = (fdb_kvs_handle *)0x0;
      do {
        pcStack_35b0 = (code *)0x11c9ba;
        fdb_set(apfStack_3568[(long)pfVar12],*(fdb_doc **)doc);
        pfVar12 = (fdb_kvs_handle *)((long)pfVar12 + 1);
      } while ((fdb_kvs_handle *)pcVar20 != pfVar12);
      pcStack_35b0 = (code *)0x11c9cf;
      fdb_doc_free(*(fdb_doc **)(&bStack_3418.ksize + uVar17 * 8));
      uVar17 = uVar17 + 1;
    } while (uVar17 != 10);
    pcStack_35b0 = (code *)0x11c9f3;
    fdb_commit((fdb_file_handle *)pfStack_3598,~(byte)uStack_359c & 1);
    uStack_359c = uStack_359c + 1;
    pcVar18 = (char *)(ulong)uStack_359c;
  } while (uStack_359c != 5);
  pcStack_35b0 = (code *)0x11ca16;
  fVar2 = fdb_get_all_snap_markers((fdb_file_handle *)pfStack_3598,&pfStack_3580,&uStack_3550);
  pfVar21 = (fdb_kvs_handle *)0xa;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_35b0 = (code *)0x11ca35;
    fVar2 = fdb_rollback(apfStack_3568,(pfStack_3580[3].kvs_markers)->seqnum);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cd19;
    pfStack_3590 = (fdb_kvs_handle *)0x0;
    pcVar18 = acStack_32c8;
    pfVar21 = (fdb_kvs_handle *)0x0;
    do {
      pcStack_35b0 = (code *)0x11ca6a;
      fVar2 = fdb_snapshot_open(apfStack_3568[(long)pfVar21],&pfStack_3570,0xffffffffffffffff);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011ccfb:
        pcStack_35b0 = (code *)0x11cd00;
        rollback_without_seqtree();
LAB_0011cd00:
        pcStack_35b0 = (code *)0x11cd05;
        rollback_without_seqtree();
LAB_0011cd05:
        pcStack_35b0 = (code *)0x11cd0a;
        rollback_without_seqtree();
LAB_0011cd0a:
        pcStack_35b0 = (code *)0x11cd0f;
        rollback_without_seqtree();
        goto LAB_0011cd0f;
      }
      pcStack_35b0 = (code *)0x11ca92;
      fVar2 = fdb_iterator_init(pfStack_3570,&pfStack_3588,(void *)0x0,0,(void *)0x0,0,0);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011ccf6:
        pcStack_35b0 = (code *)0x11ccfb;
        rollback_without_seqtree();
        goto LAB_0011ccfb;
      }
      metalen._M_i = 0;
      do {
        pcStack_35b0 = (code *)0x11caac;
        fVar2 = fdb_iterator_get(pfStack_3588,(fdb_doc **)&pfStack_3590);
        if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011ccd1:
          pcStack_35b0 = (code *)0x11ccd6;
          rollback_without_seqtree();
LAB_0011ccd6:
          pcStack_35b0 = (code *)0x11cce6;
          rollback_without_seqtree();
LAB_0011cce6:
          pcStack_35b0 = (code *)0x11ccf6;
          rollback_without_seqtree();
          goto LAB_0011ccf6;
        }
        pcStack_35b0 = (code *)0x11cacd;
        sprintf(acStack_33c8,"key%d",metalen._M_i);
        if (pfVar21 == (fdb_kvs_handle *)0x0) {
          pcStack_35b0 = (code *)0x11cb1c;
          sprintf(acStack_3518,"meta-1-%d",metalen._M_i);
          pcStack_35b0 = (code *)0x11cb30;
          sprintf(pcVar18,"body-1-%d",metalen._M_i);
        }
        else {
          pcStack_35b0 = (code *)0x11caf0;
          sprintf(acStack_3518,"meta-%d-%d",4,metalen._M_i);
          pcStack_35b0 = (code *)0x11cb09;
          sprintf(pcVar18,"body-%d-%d",4);
        }
        pfVar12 = pfStack_3590;
        doc = (btree *)pfStack_3590->op_stats;
        pcStack_35b0 = (code *)0x11cb4c;
        iVar3 = bcmp(doc,acStack_33c8,*(size_t *)&pfStack_3590->kvs_config);
        if (iVar3 != 0) {
          pcStack_35b0 = (code *)0x11ccd1;
          rollback_without_seqtree();
          goto LAB_0011ccd1;
        }
        doc = pfVar12->staletree;
        pcStack_35b0 = (code *)0x11cb6c;
        iVar3 = bcmp(doc,acStack_3518,(size_t)(pfVar12->kvs_config).custom_cmp);
        if (iVar3 != 0) goto LAB_0011cce6;
        doc = (pfVar12->field_6).seqtree;
        pcStack_35b0 = (code *)0x11cb87;
        iVar3 = bcmp(doc,pcVar18,(size_t)(pfVar12->kvs_config).custom_cmp_param);
        if (iVar3 != 0) goto LAB_0011ccd6;
        pcStack_35b0 = (code *)0x11cb97;
        fdb_doc_free((fdb_doc *)pfVar12);
        pfStack_3590 = (fdb_kvs_handle *)0x0;
        uVar11 = (int)metalen._M_i + 1;
        metalen._M_i = (__int_type)uVar11;
        pcStack_35b0 = (code *)0x11cbad;
        fVar2 = fdb_iterator_next(pfStack_3588);
      } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
      if (uVar11 != 10) goto LAB_0011cd00;
      pcStack_35b0 = (code *)0x11cbca;
      fVar2 = fdb_iterator_close(pfStack_3588);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cd05;
      pcStack_35b0 = (code *)0x11cbdc;
      fVar2 = fdb_kvs_close(pfStack_3570);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cd0a;
      pfVar21 = (fdb_kvs_handle *)&(pfVar21->kvs_config).field_0x1;
    } while (pfVar21 != (fdb_kvs_handle *)pcVar20);
    pcVar18 = (char *)0x0;
    do {
      pcStack_35b0 = (code *)0x11cbfc;
      fVar2 = fdb_kvs_close(apfStack_3568[(long)pcVar18]);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cd0f;
      pcVar18 = pcVar18 + 1;
    } while (pcVar20 != pcVar18);
    pcStack_35b0 = (code *)0x11cc1f;
    fVar2 = fdb_rollback_all((fdb_file_handle *)pfStack_3598,pfStack_3580[3].marker);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cd1e;
    pcStack_35b0 = (code *)0x11cc36;
    fVar2 = fdb_free_snap_markers(pfStack_3580,uStack_3550);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_35b0 = (code *)0x11cc48;
      fdb_close((fdb_file_handle *)pfStack_3598);
      pcStack_35b0 = (code *)0x11cc4d;
      fdb_shutdown();
      pcStack_35b0 = (code *)0x11cc52;
      memleak_end();
      pcVar20 = "single kv mode:";
      if ((char)iStack_3574 != '\0') {
        pcVar20 = "multiple kv mode:";
      }
      pcStack_35b0 = (code *)0x11cc82;
      sprintf(acStack_32c8,"rollback without seqtree in %s",pcVar20);
      pcVar20 = "%s PASSED\n";
      if (rollback_without_seqtree(bool)::__test_pass != '\0') {
        pcVar20 = "%s FAILED\n";
      }
      pcStack_35b0 = (code *)0x11ccaf;
      fprintf(_stderr,pcVar20,acStack_32c8);
      return;
    }
  }
  else {
LAB_0011cd14:
    pcStack_35b0 = (code *)0x11cd19;
    rollback_without_seqtree();
LAB_0011cd19:
    pcStack_35b0 = (code *)0x11cd1e;
    rollback_without_seqtree();
LAB_0011cd1e:
    pcStack_35b0 = (code *)0x11cd23;
    rollback_without_seqtree();
  }
  pcStack_35b0 = tx_crash_recover_test;
  rollback_without_seqtree();
  pfStack_3788 = (fdb_kvs_handle *)0x11cd45;
  pcStack_35d8 = pcVar18;
  aStack_35d0.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)metalen._M_i;
  pbStack_35c8 = doc;
  pfStack_35c0 = pfVar12;
  pfStack_35b8 = pfVar21;
  pcStack_35b0 = (code *)pcVar20;
  gettimeofday(&tStack_3728,(__timezone_ptr_t)0x0);
  pfStack_3788 = (fdb_kvs_handle *)0x11cd4a;
  memleak_start();
  pfStack_3788 = (fdb_kvs_handle *)0x11cd56;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcVar20 = auStack_3718 + 0x48;
  pfStack_3788 = (fdb_kvs_handle *)0x11cd66;
  fdb_get_default_config();
  pfStack_3788 = (fdb_kvs_handle *)0x11cd78;
  fVar2 = fdb_open(&pfStack_3780,"./mvcc_test2",(fdb_config *)pcVar20);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcVar20 = auStack_3718;
    pfStack_3788 = (fdb_kvs_handle *)0x11cd8d;
    fdb_get_default_kvs_config();
    pbStack_3730 = (btreeblk_handle *)auStack_3718._16_8_;
    pfStack_3740 = (filemgr *)auStack_3718._0_8_;
    pdStack_3738 = (docio_handle *)auStack_3718._8_8_;
    pfStack_3788 = (fdb_kvs_handle *)0x11cdae;
    fVar2 = fdb_kvs_open_default(pfStack_3780,&pfStack_3778,(fdb_kvs_config *)&pfStack_3740);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0b9;
    pfStack_3788 = (fdb_kvs_handle *)0x11cdc4;
    fVar2 = fdb_begin_transaction(pfStack_3780,'\x03');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0be;
    pcVar20 = "key%d";
    pfVar12 = (fdb_kvs_handle *)acStack_376f;
    pfVar21 = (fdb_kvs_handle *)0x1555bd;
    uVar17 = 0;
    do {
      pfStack_3788 = (fdb_kvs_handle *)0x11cdf0;
      sprintf((char *)pfVar12,"key%d",uVar17);
      pfVar15 = pfStack_3778;
      pfStack_3788 = (fdb_kvs_handle *)0x11cdfd;
      sVar5 = strlen((char *)pfVar12);
      pfStack_3788 = (fdb_kvs_handle *)0x11ce14;
      fVar2 = fdb_set_kv(pfVar15,pfVar12,sVar5,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_3788 = (fdb_kvs_handle *)0x11d0a5;
        tx_crash_recover_test();
        goto LAB_0011d0a5;
      }
      uVar11 = (int)uVar17 + 1;
      uVar17 = (ulong)uVar11;
    } while (uVar11 != 10);
    pfStack_3788 = (fdb_kvs_handle *)0x11ce31;
    fVar2 = fdb_end_transaction(pfStack_3780,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0c3;
    pfStack_3788 = (fdb_kvs_handle *)0x11ce49;
    fdb_compact(pfStack_3780,"./mvcc_test3");
    pfStack_3788 = (fdb_kvs_handle *)0x11ce57;
    fVar2 = fdb_begin_transaction(pfStack_3780,'\x03');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0c8;
    pcVar20 = "key%d";
    pfVar12 = (fdb_kvs_handle *)acStack_376f;
    uVar11 = 0;
    do {
      pfStack_3788 = (fdb_kvs_handle *)0x11ce7c;
      sprintf((char *)pfVar12,"key%d",(ulong)uVar11);
      pfVar21 = pfStack_3778;
      pfStack_3788 = (fdb_kvs_handle *)0x11ce89;
      sVar5 = strlen((char *)pfVar12);
      pfStack_3788 = (fdb_kvs_handle *)0x11ce97;
      fVar2 = fdb_del_kv(pfVar21,pfVar12,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0a5;
      uVar11 = uVar11 + 1;
    } while (uVar11 != 10);
    pfStack_3788 = (fdb_kvs_handle *)0x11ceb4;
    fVar2 = fdb_get_file_info(pfStack_3780,(fdb_file_info *)auStack_3718);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0cd;
    pcVar20 = (char *)((ulong)auStack_3718._40_8_ / (ulong)uStack_36cc);
    pfStack_3788 = (fdb_kvs_handle *)0x11cedc;
    fdb_close(pfStack_3780);
    pfStack_3788 = (fdb_kvs_handle *)0x11cee1;
    fdb_shutdown();
    pfStack_3788 = (fdb_kvs_handle *)0x11cf00;
    iVar3 = _disk_dump("./mvcc_test3",(ulong)uStack_36cc * (long)pcVar20,
                       (ulong)((uStack_36cc >> 2) + uStack_36cc * 2));
    if (iVar3 < 0) goto LAB_0011d0d2;
    pfStack_3788 = (fdb_kvs_handle *)0x11cf2a;
    iVar3 = _disk_dump("./mvcc_test2",((long)pcVar20 * 4 + 8) * (ulong)uStack_36cc,
                       (ulong)(uStack_36cc >> 2));
    if (iVar3 < 0) goto LAB_0011d0d7;
    pfStack_3788 = (fdb_kvs_handle *)0x11cf49;
    fVar2 = fdb_open(&pfStack_3780,"./mvcc_test3",(fdb_config *)(auStack_3718 + 0x48));
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0dc;
    pcVar20 = (char *)&pfStack_3760;
    pfStack_3788 = (fdb_kvs_handle *)0x11cf5e;
    fdb_get_default_kvs_config();
    pbStack_3730 = pbStack_3750;
    pfStack_3740 = pfStack_3760;
    pdStack_3738 = pdStack_3758;
    pfStack_3788 = (fdb_kvs_handle *)0x11cf7f;
    fVar2 = fdb_kvs_open_default(pfStack_3780,&pfStack_3778,(fdb_kvs_config *)&pfStack_3740);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0e1;
    pfStack_3788 = (fdb_kvs_handle *)0x11cf95;
    fVar2 = fdb_begin_transaction(pfStack_3780,'\x03');
    if (fVar2 == FDB_RESULT_SUCCESS) {
      uVar11 = 0;
      do {
        pfStack_3788 = (fdb_kvs_handle *)0x11cfba;
        sprintf(acStack_376f,"key%d",(ulong)uVar11);
        pfVar21 = pfStack_3778;
        pfStack_3788 = (fdb_kvs_handle *)0x11cfc7;
        sVar5 = strlen(acStack_376f);
        pfStack_3788 = (fdb_kvs_handle *)0x11cfd5;
        fVar2 = fdb_del_kv(pfVar21,acStack_376f,sVar5);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0aa;
        uVar11 = uVar11 + 1;
      } while (uVar11 != 10);
      pfStack_3788 = (fdb_kvs_handle *)0x11cfed;
      fdb_abort_transaction(pfStack_3780);
      pfVar21 = (fdb_kvs_handle *)&pfStack_3760;
      uVar11 = 0;
      while( true ) {
        pfStack_3788 = (fdb_kvs_handle *)0x11d014;
        sprintf(acStack_376f,"key%d",(ulong)uVar11);
        pfVar12 = pfStack_3778;
        pfStack_3788 = (fdb_kvs_handle *)0x11d021;
        sVar5 = strlen(acStack_376f);
        pfStack_3788 = (fdb_kvs_handle *)0x11d035;
        fVar2 = fdb_get_kv(pfVar12,acStack_376f,sVar5,(void **)pfVar21,&sStack_3748);
        if (fVar2 != FDB_RESULT_SUCCESS) break;
        pfStack_3788 = (fdb_kvs_handle *)0x11d043;
        free(pfStack_3760);
        uVar11 = uVar11 + 1;
        if (uVar11 == 10) {
          pfStack_3788 = (fdb_kvs_handle *)0x11d053;
          fdb_close(pfStack_3780);
          pfStack_3788 = (fdb_kvs_handle *)0x11d058;
          fdb_shutdown();
          pfStack_3788 = (fdb_kvs_handle *)0x11d05d;
          memleak_end();
          pcVar20 = "%s PASSED\n";
          if (tx_crash_recover_test()::__test_pass != '\0') {
            pcVar20 = "%s FAILED\n";
          }
          pfStack_3788 = (fdb_kvs_handle *)0x11d08e;
          fprintf(_stderr,pcVar20,"crash recover test");
          return;
        }
      }
LAB_0011d0af:
      pfVar12 = (fdb_kvs_handle *)acStack_376f;
      pcVar20 = "key%d";
      pfStack_3788 = (fdb_kvs_handle *)0x11d0b4;
      tx_crash_recover_test();
      goto LAB_0011d0b4;
    }
  }
  else {
LAB_0011d0b4:
    pfStack_3788 = (fdb_kvs_handle *)0x11d0b9;
    tx_crash_recover_test();
LAB_0011d0b9:
    pfStack_3788 = (fdb_kvs_handle *)0x11d0be;
    tx_crash_recover_test();
LAB_0011d0be:
    pfStack_3788 = (fdb_kvs_handle *)0x11d0c3;
    tx_crash_recover_test();
LAB_0011d0c3:
    pfStack_3788 = (fdb_kvs_handle *)0x11d0c8;
    tx_crash_recover_test();
LAB_0011d0c8:
    pfStack_3788 = (fdb_kvs_handle *)0x11d0cd;
    tx_crash_recover_test();
LAB_0011d0cd:
    pfStack_3788 = (fdb_kvs_handle *)0x11d0d2;
    tx_crash_recover_test();
LAB_0011d0d2:
    pfStack_3788 = (fdb_kvs_handle *)0x11d0d7;
    tx_crash_recover_test();
LAB_0011d0d7:
    pfStack_3788 = (fdb_kvs_handle *)0x11d0dc;
    tx_crash_recover_test();
LAB_0011d0dc:
    pfStack_3788 = (fdb_kvs_handle *)0x11d0e1;
    tx_crash_recover_test();
LAB_0011d0e1:
    pfStack_3788 = (fdb_kvs_handle *)0x11d0e6;
    tx_crash_recover_test();
  }
  pfStack_3788 = (fdb_kvs_handle *)drop_kv_on_snap_iterator_test;
  tx_crash_recover_test();
  pfStack_3798 = (fdb_config *)pcVar20;
  pfStack_3790 = pfVar12;
  pfStack_3788 = pfVar21;
  gettimeofday(&tStack_38b8,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  pfStack_38c8 = (fdb_doc *)0x0;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_open(&pfStack_38d8,"./mvcc_test1",&fStack_3890);
  fdb_kvs_open_default(pfStack_38d8,&pfStack_38c0,&fStack_38a8);
  fdb_kvs_open(pfStack_38d8,&pfStack_38e0,"kv",&fStack_38a8);
  fVar2 = fdb_set_kv(pfStack_38e0,"a",1,(void *)0x0,0);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_set_kv(pfStack_38e0,"b",1,(void *)0x0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d304;
    fdb_commit(pfStack_38d8,'\x01');
    fVar2 = fdb_snapshot_open(pfStack_38e0,&pfStack_38e8,2);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d30b;
    fVar2 = fdb_iterator_init(pfStack_38e8,&pfStack_38d0,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d310;
    fVar2 = fdb_kvs_close(pfStack_38e8);
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011d315;
    fVar2 = fdb_kvs_close(pfStack_38e0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d31a;
    fVar2 = fdb_kvs_remove(pfStack_38d8,"kv");
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011d31f;
    fVar2 = fdb_iterator_get(pfStack_38d0,&pfStack_38c8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d324;
    fdb_doc_free(pfStack_38c8);
    fVar2 = fdb_iterator_close(pfStack_38d0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d329;
    fVar2 = fdb_kvs_close(pfStack_38e8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d32e;
    fVar2 = fdb_kvs_close(pfStack_38c0);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fVar2 = fdb_close(pfStack_38d8);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        fdb_shutdown();
        memleak_end();
        pcVar20 = "%s PASSED\n";
        if (drop_kv_on_snap_iterator_test()::__test_pass != '\0') {
          pcVar20 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar20,"drop kv other handle test");
        return;
      }
      goto LAB_0011d338;
    }
  }
  else {
    drop_kv_on_snap_iterator_test();
LAB_0011d304:
    drop_kv_on_snap_iterator_test();
LAB_0011d30b:
    drop_kv_on_snap_iterator_test();
LAB_0011d310:
    drop_kv_on_snap_iterator_test();
LAB_0011d315:
    drop_kv_on_snap_iterator_test();
LAB_0011d31a:
    drop_kv_on_snap_iterator_test();
LAB_0011d31f:
    drop_kv_on_snap_iterator_test();
LAB_0011d324:
    drop_kv_on_snap_iterator_test();
LAB_0011d329:
    drop_kv_on_snap_iterator_test();
LAB_0011d32e:
    drop_kv_on_snap_iterator_test();
  }
  drop_kv_on_snap_iterator_test();
LAB_0011d338:
  drop_kv_on_snap_iterator_test();
  concurrent_writer_iterator_test();
  in_memory_snapshot_cleanup_test();
  drop_kv_on_snap_iterator_test();
  rollback_secondary_kvs();
  multi_version_test();
  crash_recovery_test(true);
  crash_recovery_test(false);
  snapshot_test();
  in_memory_snapshot_rollback_test();
  in_memory_snapshot_test();
  in_memory_snapshot_on_dirty_hbtrie_test();
  in_memory_snapshot_compaction_test();
  snapshot_clone_test();
  snapshot_parallel_clone_test();
  snapshot_stats_test();
  snapshot_with_uncomitted_data_test();
  snapshot_markers_in_file_test(true);
  snapshot_markers_in_file_test(false);
  snapshot_with_deletes_test();
  snapshot_without_seqtree(true);
  snapshot_without_seqtree(false);
  rollback_during_ops_test((void *)0x0);
  rollback_forward_seqnum();
  rollback_test(false);
  rollback_test(true);
  rollback_and_snapshot_test();
  rollback_ncommits();
  transaction_test();
  transaction_simple_api_test();
  transaction_in_memory_snapshot_test();
  rollback_prior_to_ops(true);
  rollback_prior_to_ops(false);
  snapshot_concurrent_compaction_test();
  rollback_to_zero_test(true);
  rollback_to_zero_test(false);
  rollback_to_zero_after_compact_test(false);
  rollback_to_zero_after_compact_test(true);
  rollback_all_test(true);
  rollback_all_test(false);
  rollback_to_wal_test(true);
  rollback_to_wal_test(false);
  rollback_drop_multi_files_kvs_test();
  rollback_without_seqtree(true);
  rollback_without_seqtree(false);
  tx_crash_recover_test();
  auto_compaction_snapshots_test();
  return;
}

Assistant:

void rollback_all_test(bool multi_kv)
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 20;
    int num_kvs = 4; // keep this the same as number of fdb_commit() calls
    fdb_file_handle *dbfile;
    fdb_kvs_handle **db = alca(fdb_kvs_handle *, num_kvs);
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_kvs_info info;
    fdb_snapshot_info_t *markers;
    fdb_seqnum_t rollback_seq;
    uint64_t num_markers;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];
    char kv_name[8];

    // remove previous dummy files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.multi_kv_instances = multi_kv;
    fconfig.block_reusing_threshold = 0;

    fdb_open(&dbfile, "./mvcc_test6", &fconfig);
    if (multi_kv) {
        for (r = 0; r < num_kvs; ++r) {
            sprintf(kv_name, "kv%d", r);
            fdb_kvs_open(dbfile, &db[r], kv_name, &kvs_config);
        }
    } else {
        num_kvs = 1;
        fdb_kvs_open_default(dbfile, &db[0], &kvs_config);
    }

    for (r = 0; r < num_kvs; ++r) {
        status = fdb_set_log_callback(db[r], logCallbackFunc,
                                      (void *) "rollback_all_test");
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

   // ------- Setup test ----------------------------------
   // insert documents of 0-4
    for (i=0; i<n/4; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }

    // commit with a manual WAL flush (these docs go into HB-trie)
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert documents from 5 - 9
    for (; i < n/2; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }

    // commit again without a WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // insert documents from 10-14 into HB-trie
    for (; i < (n/2 + n/4); i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }
    // manually flush WAL & commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert documents from 15 - 19 on file into the WAL
    for (; i < n; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }
    // commit without a WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    status = fdb_get_all_snap_markers(dbfile, &markers, &num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    if (multi_kv) {
        TEST_CHK(num_markers == 8);
    } else {
        TEST_CHK(num_markers == 4);
    }

    // rollback to 15
    i = 1;
    rollback_seq = (fdb_seqnum_t)(n - (i*5));
    status = fdb_rollback_all(dbfile, markers[i].marker);
    if (multi_kv) {
        // In multi-kv mode, we cannot rollback all instances,
        // without closing them first, since a rollback point
        // may end up invalidating open handles
        TEST_CHK(status == FDB_RESULT_KV_STORE_BUSY);

        for (r = 0; r < num_kvs; ++r) {
            fdb_kvs_close(db[r]);
        }

        fdb_file_handle *fhandle;
        fdb_kvs_handle *dbhandle;
        status = fdb_open(&fhandle, "./mvcc_test6", &fconfig);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_kvs_open(fhandle, &dbhandle, "kv0", &kvs_config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        // Rollback again, but should fail again because there is a new handle created
        status = fdb_rollback_all(dbfile, markers[i].marker);
        TEST_CHK(status == FDB_RESULT_KV_STORE_BUSY);
        // Close the handle to have the rollback pass
        status = fdb_kvs_close(dbhandle);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_close(fhandle);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        status = fdb_rollback_all(dbfile, markers[i].marker);
    }

    TEST_CHK(status == FDB_RESULT_SUCCESS);

    if (multi_kv) {
        for (r = 0; r < num_kvs; ++r) {
            sprintf(kv_name, "kv%d", r);
            status = fdb_kvs_open(dbfile, &db[r], kv_name, &kvs_config);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            status = fdb_set_log_callback(db[r], logCallbackFunc,
                    (void *) "rollback_all_test");
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    }

    for (r = 0; r < num_kvs; ++r) {
        char *body;
        size_t bodylen;
        status = fdb_get_kvs_info(db[r], &info);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(info.last_seqnum == rollback_seq);
        TEST_CHK(info.doc_count == rollback_seq);
        status = fdb_get(db[r], doc[n - 1]);
        TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        status = fdb_get_kv(db[r], doc[0]->key, doc[0]->keylen,
                            (void **)&body, &bodylen);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(doc[0]->body, body, bodylen);
        free(body);
    }

    // test normal operation after rollbacks manually flush WAL & commit
    for (r = 0; r < num_kvs; ++r) {
        status = fdb_set(db[r], doc[0]);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // close db file
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    status = fdb_free_snap_markers(markers, num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // free all resources
    fdb_shutdown();

    memleak_end();

    sprintf(bodybuf, "rollback all test %s", multi_kv ? "multiple kv mode:"
                                                      : "single kv mode:");
    TEST_RESULT(bodybuf);
}